

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O1

uint32 __thiscall
Clasp::UncoreMinimize::allocCore
          (UncoreMinimize *this,WeightConstraint *con,weight_t bound,weight_t weight,bool open)

{
  uint uVar1;
  pointer pCVar2;
  uint32 uVar3;
  undefined7 in_register_00000081;
  Core local_18;
  
  local_18.con = con;
  if ((int)CONCAT71(in_register_00000081,open) == 0) {
    bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::push_back
              (&this->closed_,(Constraint **)&local_18);
    uVar3 = 0;
  }
  else {
    uVar3 = this->freeOpen_;
    if (uVar3 == 0) {
      local_18.bound = bound;
      local_18.weight = weight;
      bk_lib::pod_vector<Clasp::UncoreMinimize::Core,_std::allocator<Clasp::UncoreMinimize::Core>_>
      ::push_back(&this->open_,&local_18);
      uVar3 = (this->open_).ebo_.size;
    }
    else {
      uVar1 = uVar3 - 1;
      pCVar2 = (this->open_).ebo_.buf;
      this->freeOpen_ = pCVar2[uVar1].weight;
      pCVar2[uVar1].con = con;
      pCVar2[uVar1].bound = bound;
      pCVar2[uVar1].weight = weight;
    }
  }
  return uVar3;
}

Assistant:

uint32 UncoreMinimize::allocCore(WeightConstraint* con, weight_t bound, weight_t weight, bool open) {
	if (!open) {
		closed_.push_back(con);
		return 0;
	}
	if (freeOpen_) { // pop next slot from free list
		uint32 fp = freeOpen_ - 1;
		assert(open_[fp].con == 0 && open_[fp].bound == static_cast<weight_t>(0xDEADC0DE));
		freeOpen_ = static_cast<uint32>(open_[fp].weight);
		open_[fp] = Core(con, bound, weight);
		return fp + 1;
	}
	open_.push_back(Core(con, bound, weight));
	return static_cast<uint32>(open_.size());
}